

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::emplace<QDockAreaLayoutItem>
          (QGenericArrayOps<QDockAreaLayoutItem> *this,qsizetype i,QDockAreaLayoutItem *args)

{
  QDockAreaLayoutItem **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QDockAreaLayoutItem *pQVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QDockAreaLayoutItem tmp;
  Inserter local_a8;
  undefined1 local_58 [32];
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_003fb2f3:
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QDockAreaLayoutItem::QDockAreaLayoutItem((QDockAreaLayoutItem *)local_58,args);
    bVar5 = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).size != 0;
    QArrayDataPointer<QDockAreaLayoutItem>::detachAndGrow
              (&this->super_QArrayDataPointer<QDockAreaLayoutItem>,(uint)(i == 0 && bVar5),1,
               (QDockAreaLayoutItem **)0x0,(QArrayDataPointer<QDockAreaLayoutItem> *)0x0);
    if (i == 0 && bVar5) {
      QDockAreaLayoutItem::QDockAreaLayoutItem
                ((this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr + -1,
                 (QDockAreaLayoutItem *)local_58);
      ppQVar1 = &(this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QArrayDataPointer<QDockAreaLayoutItem>).size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_a8.sourceCopyConstruct = 0;
      local_a8.nSource = 0;
      local_a8.move = 0;
      local_a8.sourceCopyAssign = 0;
      local_a8.end = (QDockAreaLayoutItem *)0x0;
      local_a8.last = (QDockAreaLayoutItem *)0x0;
      local_a8.where = (QDockAreaLayoutItem *)0x0;
      local_a8.begin = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr;
      local_a8.size = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).size;
      local_a8.data = &this->super_QArrayDataPointer<QDockAreaLayoutItem>;
      Inserter::insertOne(&local_a8,i,(QDockAreaLayoutItem *)local_58);
      (local_a8.data)->ptr = local_a8.begin;
      (local_a8.data)->size = local_a8.size;
    }
    QDockAreaLayoutItem::~QDockAreaLayoutItem((QDockAreaLayoutItem *)local_58);
  }
  else {
    if (((this->super_QArrayDataPointer<QDockAreaLayoutItem>).size == i) &&
       (pQVar4 = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pQVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x3333333333333333)) {
      QDockAreaLayoutItem::QDockAreaLayoutItem(pQVar4 + i,args);
    }
    else {
      if ((i != 0) ||
         (pQVar4 = (this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr,
         (QDockAreaLayoutItem *)
         ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar4))
      goto LAB_003fb2f3;
      QDockAreaLayoutItem::QDockAreaLayoutItem(pQVar4 + -1,args);
      ppQVar1 = &(this->super_QArrayDataPointer<QDockAreaLayoutItem>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QDockAreaLayoutItem>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }